

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O2

void iutest::detail::PrintToChar<wchar_t>(wchar_t value,iu_ostream *os)

{
  ostream *poVar1;
  wchar_t str [2];
  string local_40;
  wchar_t local_20 [2];
  
  if (value != L'\0') {
    if (value < L' ') {
      poVar1 = std::operator<<(os,"0x");
      ToHexString<wchar_t>(&local_40,value);
      std::operator<<(poVar1,(string *)&local_40);
    }
    else {
      local_20[1] = 0;
      local_20[0] = value;
      poVar1 = std::operator<<(os,"\'");
      ShowAnyCString<wchar_t>(&local_40,local_20);
      poVar1 = std::operator<<(poVar1,(string *)&local_40);
      std::operator<<(poVar1,"\'");
    }
    std::__cxx11::string::~string((string *)&local_40);
    return;
  }
  std::operator<<(os,"\\0");
  return;
}

Assistant:

void PrintToChar(const T value, iu_ostream* os)
{
    // char or unsigned char の時に、 0 が NULL 文字にならないように修正
    if( value == 0 )
    {
        *os << "\\0";
    }
    else if( static_cast<int>(value) < 0x20 )
    {
        *os << "0x" << ToHexString(value);
    }
    else
    {
        const T str[2] = { value, 0 };
        *os << "\'" << detail::ShowAnyCString(str) << "\'";
    }
}